

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O1

void google::protobuf::strings::SubstituteAndAppend
               (string *output,char *format,SubstituteArg *arg0,SubstituteArg *arg1,
               SubstituteArg *arg2,SubstituteArg *arg3,SubstituteArg *arg4,SubstituteArg *arg5,
               SubstituteArg *arg6,SubstituteArg *arg7,SubstituteArg *arg8,SubstituteArg *arg9)

{
  byte bVar1;
  size_type sVar2;
  undefined8 *puVar3;
  string *psVar4;
  char cVar5;
  pointer pcVar6;
  LogMessage *pLVar7;
  int iVar8;
  SubstituteArg *pSVar9;
  int iVar10;
  ulong uVar11;
  uint value;
  int iVar12;
  long lVar13;
  char *__dest;
  bool bVar14;
  SubstituteArg *args_array [11];
  long alStack_208 [27];
  undefined8 uStack_130;
  LogFinisher local_122;
  allocator<char> local_121;
  string local_120;
  int local_fc;
  string local_f8;
  string *local_d8;
  SubstituteArg *local_d0;
  ulong local_c8;
  LogMessage local_c0;
  SubstituteArg *local_88 [5];
  SubstituteArg *pSStack_60;
  SubstituteArg *local_58;
  SubstituteArg *pSStack_50;
  SubstituteArg *local_48;
  SubstituteArg *pSStack_40;
  undefined8 local_38;
  
  local_d8 = output;
  local_d0 = arg0;
  local_88[0] = arg0;
  local_88[1] = arg1;
  local_88[2] = arg2;
  local_88[3] = arg3;
  local_88[4] = arg4;
  pSStack_60 = arg5;
  local_58 = arg6;
  pSStack_50 = arg7;
  local_48 = arg8;
  pSStack_40 = arg9;
  local_38 = 0;
  cVar5 = *format;
  bVar14 = cVar5 != '\0';
  if (cVar5 == '\0') {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    lVar13 = 0;
    do {
      iVar12 = (int)lVar13;
      iVar10 = (int)uVar11;
      if (cVar5 == '$') {
        bVar1 = format[(long)iVar12 + 1];
        if ((byte)(bVar1 - 0x30) < 10) {
          value = bVar1 - 0x30;
          iVar8 = local_88[value]->size_;
          if (iVar8 == -1) {
            uStack_130 = 0x221e33;
            local_fc = iVar8;
            local_c8 = uVar11;
            internal::LogMessage::LogMessage
                      (&local_c0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/substitute.cc"
                       ,0x54);
            uStack_130 = 0x221e42;
            pLVar7 = internal::LogMessage::operator<<
                               (&local_c0,"strings::Substitute format string invalid: asked for \"$"
                               );
            uStack_130 = 0x221e4d;
            pLVar7 = internal::LogMessage::operator<<(pLVar7,value);
            uStack_130 = 0x221e5c;
            pLVar7 = internal::LogMessage::operator<<(pLVar7,"\", but only ");
            lVar13 = 0;
            pSVar9 = local_d0;
            do {
              if (pSVar9->size_ == -1) break;
              pSVar9 = local_88[lVar13 + 1];
              lVar13 = lVar13 + 1;
            } while (pSVar9 != (SubstituteArg *)0x0);
            uStack_130 = 0x221e81;
            pLVar7 = internal::LogMessage::operator<<(pLVar7,(int)lVar13);
            uStack_130 = 0x221e90;
            pLVar7 = internal::LogMessage::operator<<
                               (pLVar7," args were given.  Full format string was: \"");
            uStack_130 = 0x221ea8;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f8,format,&local_121);
            uStack_130 = 0x221eb3;
            CEscape(&local_120,&local_f8);
            uStack_130 = 0x221ebe;
            pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_120);
            uStack_130 = 0x221ecd;
            pLVar7 = internal::LogMessage::operator<<(pLVar7,"\".");
            uStack_130 = 0x221eda;
            internal::LogFinisher::operator=(&local_122,pLVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              uStack_130 = 0x221ef6;
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              uStack_130 = 0x221f12;
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            uStack_130 = 0x221f1c;
            internal::LogMessage::~LogMessage(&local_c0);
            uVar11 = local_c8;
            iVar8 = local_fc;
          }
          else {
            uVar11 = (ulong)(uint)(iVar10 + iVar8);
            iVar12 = iVar12 + 1;
          }
          if (iVar8 == -1) break;
        }
        else {
          if (bVar1 != 0x24) {
            uStack_130 = 0x221f74;
            internal::LogMessage::LogMessage
                      (&local_c0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/substitute.cc"
                       ,0x61);
            uStack_130 = 0x221f83;
            pLVar7 = internal::LogMessage::operator<<
                               (&local_c0,"Invalid strings::Substitute() format string: \"");
            uStack_130 = 0x221f98;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f8,format,&local_121);
            uStack_130 = 0x221fa7;
            CEscape(&local_120,&local_f8);
            uStack_130 = 0x221fb4;
            pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_120);
            uStack_130 = 0x221fc3;
            pLVar7 = internal::LogMessage::operator<<(pLVar7,"\".");
            uStack_130 = 0x221fd0;
            internal::LogFinisher::operator=(&local_122,pLVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              uStack_130 = 0x221fec;
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              uStack_130 = 0x222008;
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            uStack_130 = 0x222012;
            internal::LogMessage::~LogMessage(&local_c0);
            break;
          }
          uVar11 = (ulong)(iVar10 + 1);
          iVar12 = iVar12 + 1;
        }
      }
      else {
        uVar11 = (ulong)(iVar10 + 1);
      }
      cVar5 = format[(long)iVar12 + 1];
      lVar13 = (long)iVar12 + 1;
      bVar14 = cVar5 != '\0';
    } while (bVar14);
  }
  psVar4 = local_d8;
  if ((!bVar14) && ((int)uVar11 != 0)) {
    sVar2 = local_d8->_M_string_length;
    iVar12 = 0;
    uStack_130 = 0x222041;
    std::__cxx11::string::resize((ulong)local_d8,(char)uVar11 + (char)sVar2);
    if (psVar4->_M_string_length == 0) {
      pcVar6 = (pointer)0x0;
    }
    else {
      pcVar6 = (psVar4->_M_dataplus)._M_p;
    }
    __dest = pcVar6 + (int)sVar2;
    do {
      cVar5 = format[iVar12];
      if (cVar5 == '$') {
        bVar1 = format[(long)iVar12 + 1];
        if ((byte)(bVar1 - 0x30) < 10) {
          puVar3 = (undefined8 *)alStack_208[bVar1];
          uStack_130 = 0x22209a;
          memcpy(__dest,(void *)*puVar3,(long)*(int *)(puVar3 + 1));
          __dest = __dest + *(int *)(puVar3 + 1);
          iVar12 = iVar12 + 1;
        }
        else if (bVar1 == 0x24) {
          *__dest = '$';
          __dest = __dest + 1;
          iVar12 = iVar12 + 1;
        }
      }
      else {
        if (cVar5 == '\0') {
          if ((long)__dest - (long)(psVar4->_M_dataplus)._M_p == psVar4->_M_string_length) {
            return;
          }
          uStack_130 = 0x2220e2;
          internal::LogMessage::LogMessage
                    (&local_c0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/substitute.cc"
                     ,0x81);
          uStack_130 = 0x2220f1;
          pLVar7 = internal::LogMessage::operator<<
                             (&local_c0,
                              "CHECK failed: (target - output->data()) == (output->size()): ");
          uStack_130 = 0x2220fe;
          internal::LogFinisher::operator=((LogFinisher *)&local_120,pLVar7);
          uStack_130 = 0x222108;
          internal::LogMessage::~LogMessage(&local_c0);
          return;
        }
        *__dest = cVar5;
        __dest = __dest + 1;
      }
      iVar12 = iVar12 + 1;
    } while( true );
  }
  return;
}

Assistant:

void SubstituteAndAppend(
    string* output, const char* format,
    const SubstituteArg& arg0, const SubstituteArg& arg1,
    const SubstituteArg& arg2, const SubstituteArg& arg3,
    const SubstituteArg& arg4, const SubstituteArg& arg5,
    const SubstituteArg& arg6, const SubstituteArg& arg7,
    const SubstituteArg& arg8, const SubstituteArg& arg9) {
  const SubstituteArg* const args_array[] = {
    &arg0, &arg1, &arg2, &arg3, &arg4, &arg5, &arg6, &arg7, &arg8, &arg9, NULL
  };

  // Determine total size needed.
  int size = 0;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        int index = format[i+1] - '0';
        if (args_array[index]->size() == -1) {
          GOOGLE_LOG(DFATAL)
            << "strings::Substitute format string invalid: asked for \"$"
            << index << "\", but only " << CountSubstituteArgs(args_array)
            << " args were given.  Full format string was: \""
            << CEscape(format) << "\".";
          return;
        }
        size += args_array[index]->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        ++size;
        ++i;  // Skip next char.
      } else {
        GOOGLE_LOG(DFATAL)
          << "Invalid strings::Substitute() format string: \""
          << CEscape(format) << "\".";
        return;
      }
    } else {
      ++size;
    }
  }

  if (size == 0) return;

  // Build the string.
  int original_size = output->size();
  STLStringResizeUninitialized(output, original_size + size);
  char* target = string_as_array(output) + original_size;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        const SubstituteArg* src = args_array[format[i+1] - '0'];
        memcpy(target, src->data(), src->size());
        target += src->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        *target++ = '$';
        ++i;  // Skip next char.
      }
    } else {
      *target++ = format[i];
    }
  }

  GOOGLE_DCHECK_EQ(target - output->data(), output->size());
}